

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_energy_deleted(ofstream *fout_energy_deleted)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  pointer psVar4;
  pointer pdVar5;
  ostream *poVar6;
  ostream *in_RDI;
  int n;
  unique_ptr<double[],_std::default_delete<double[]>_> ienergy_deleted;
  double energy_ph_deleted;
  double energy_p_deleted;
  double energy_e_deleted;
  double *in_stack_ffffffffffffff88;
  undefined *__i;
  unique_ptr<double[],_std::default_delete<double[]>_> *in_stack_ffffffffffffff90;
  int local_38;
  double local_20;
  double local_18;
  double local_10;
  ostream *local_8;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)n_ion_populations;
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_8 = in_RDI;
  operator_new__(uVar3);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<double*,std::default_delete<double[]>,void,bool>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13a2d4);
  MPI_Reduce(&psVar4->energy_e_deleted,&local_10,1,&ompi_mpi_double,&ompi_mpi_op_sum,0,
             &ompi_mpi_comm_world);
  psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13a319);
  MPI_Reduce(&psVar4->energy_p_deleted,&local_18,1,&ompi_mpi_double,&ompi_mpi_op_sum,0,
             &ompi_mpi_comm_world);
  psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13a35e);
  MPI_Reduce(&psVar4->energy_ph_deleted,&local_20,1,&ompi_mpi_double,&ompi_mpi_op_sum,0,
             &ompi_mpi_comm_world);
  psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13a3a3);
  pdVar1 = psVar4->ienergy_deleted;
  pdVar5 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(in_stack_ffffffffffffff90)
  ;
  __i = &ompi_mpi_comm_world;
  MPI_Reduce(pdVar1,pdVar5,n_ion_populations,&ompi_mpi_double,&ompi_mpi_op_sum,0);
  if (mpi_rank == 0) {
    poVar6 = (ostream *)std::ostream::operator<<(local_8,local_10);
    poVar6 = std::operator<<(poVar6,'\t');
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
    poVar6 = std::operator<<(poVar6,'\t');
    std::ostream::operator<<(poVar6,local_20);
    for (local_38 = 0; local_38 < n_ion_populations; local_38 = local_38 + 1) {
      poVar6 = std::operator<<(local_8,'\t');
      in_stack_ffffffffffffff90 =
           (unique_ptr<double[],_std::default_delete<double[]>_> *)
           std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     (in_stack_ffffffffffffff90,(size_t)__i);
      std::ostream::operator<<
                (poVar6,(double)(in_stack_ffffffffffffff90->_M_t).
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl);
    }
    std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  }
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void write_energy_deleted(ofstream& fout_energy_deleted)
{
    double energy_e_deleted, energy_p_deleted, energy_ph_deleted;
    auto ienergy_deleted = unique_ptr<double[]>(new double[n_ion_populations]);
    MPI_Reduce(&(psr->energy_e_deleted), &energy_e_deleted, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->energy_p_deleted), &energy_p_deleted, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->energy_ph_deleted), &energy_ph_deleted, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(psr->ienergy_deleted, ienergy_deleted.get(), n_ion_populations, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    if (mpi_rank == 0) {
        fout_energy_deleted << energy_e_deleted << '\t' << energy_p_deleted << '\t' << energy_ph_deleted;
        for (int n=0; n<n_ion_populations; n++)
            fout_energy_deleted << '\t' << ienergy_deleted[n];
        fout_energy_deleted << endl;
    }
}